

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O2

void __thiscall
gpu::BlendFilters<unsigned_char>::apply
          (BlendFilters<unsigned_char> *this,uchar *pixelBaseR,uchar *pixelBaseG,uchar *pixelBaseB,
          uchar *pixelBlendR,uchar *pixelBlendG,uchar *pixelBlendB,uchar *pixelDestinationR,
          uchar *pixelDestinationG,uchar *pixelDestinationB,float alpha,BlendType blendType)

{
  switch(blendType) {
  case BLEND_FILTER_NORMAL:
  case BLEND_FILTER_LINEARDODGE:
    normal(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    normal(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    normal(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_LIGHTEN:
    lighten(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    lighten(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    lighten(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_DARKEN:
    darken(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    darken(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    darken(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_MULTIPLY:
    multiply(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    multiply(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    multiply(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_AVERAGE:
    average(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    average(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    average(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  default:
    return;
  case BLEND_FILTER_SUBTRACT:
    subtract(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    subtract(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    subtract(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_DIFFERENCE:
    difference(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    difference(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    difference(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_NEGATION:
    negation(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    negation(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    negation(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_SCREEN:
    screen(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    screen(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    screen(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_EXCLUSION:
    exclusion(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    exclusion(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    exclusion(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_OVERLAY:
    overlay(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    overlay(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    overlay(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_SOFTLIGHT:
    softLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    softLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    softLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_HARDLIGHT:
    hardLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    hardLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    hardLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_COLORDODGE:
    colorDodge(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    colorDodge(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    colorDodge(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_COLORBURN:
    colorBurn(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    colorBurn(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    colorBurn(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_LINEARBURN:
    linearBurn(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    linearBurn(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    linearBurn(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_LINEARLIGHT:
    linearLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    linearLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    linearLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_VIVIDLIGHT:
    vividLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    vividLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    vividLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_PINLIGHT:
    pinLight(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    pinLight(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    pinLight(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  case BLEND_FILTER_HARDMIX:
    hardMix(this,pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
    hardMix(this,pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
    hardMix(this,pixelBaseB,pixelBlendB,pixelDestinationB,alpha);
    return;
  }
}

Assistant:

FUNCTION_PREFIX void BlendFilters<T>::apply(T& pixelBaseR, 
                                                T& pixelBaseG,
                                                T& pixelBaseB,
                                                T& pixelBlendR, 
                                                T& pixelBlendG,
                                                T& pixelBlendB, 
                                                T& pixelDestinationR, 
                                                T& pixelDestinationG,
                                                T& pixelDestinationB,
                                                float alpha,
                                                BlendType blendType)
    {
      switch(blendType)
      {
      case BLEND_FILTER_NORMAL:      
        normal(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        normal(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        normal(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LIGHTEN:       
        lighten(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        lighten(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        lighten(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_DARKEN:       
        darken(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        darken(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        darken(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_MULTIPLY:     
        multiply(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        multiply(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        multiply(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_AVERAGE:      
        average(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        average(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        average(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_ADD:        
        add(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        add(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        add(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SUBTRACT:    
        subtract(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        subtract(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        subtract(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_DIFFERENCE:   
        difference(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        difference(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        difference(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_NEGATION:     
        negation(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        negation(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        negation(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SCREEN:       
        screen(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        screen(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        screen(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_EXCLUSION:   
        exclusion(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        exclusion(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        exclusion(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;   

      case BLEND_FILTER_OVERLAY:      
        overlay(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        overlay(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        overlay(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_SOFTLIGHT:   
        softLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        softLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        softLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;  

      case BLEND_FILTER_HARDLIGHT:    
        hardLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        hardLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        hardLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_COLORDODGE:    
        colorDodge(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        colorDodge(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        colorDodge(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_COLORBURN:     
        colorBurn(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        colorBurn(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        colorBurn(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARDODGE:   
        normal(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        normal(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        normal(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARBURN:    
        linearBurn(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        linearBurn(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        linearBurn(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_LINEARLIGHT: 
        linearLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        linearLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        linearLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_VIVIDLIGHT:   

        vividLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        vividLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        vividLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_PINLIGHT:     
        pinLight(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        pinLight(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        pinLight(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      case BLEND_FILTER_HARDMIX:     
        hardMix(pixelBaseR,pixelBlendR,pixelDestinationR,alpha);
        hardMix(pixelBaseG,pixelBlendG,pixelDestinationG,alpha);
        hardMix(pixelBaseB,pixelBlendB,pixelDestinationB,alpha);return;

      }
    }